

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperVec.c
# Opt level: O2

void Map_NodeVecRemove(Map_NodeVec_t *p,Map_Node_t *Entry)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar1 = p->nSize;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  lVar2 = 1;
  while( true ) {
    if (lVar2 - uVar3 == 1) {
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperVec.c"
                    ,0x100,"void Map_NodeVecRemove(Map_NodeVec_t *, Map_Node_t *)");
    }
    if (p->pArray[lVar2 + -1] == Entry) break;
    lVar2 = lVar2 + 1;
  }
  for (; (int)lVar2 < (int)uVar1; lVar2 = lVar2 + 1) {
    p->pArray[lVar2 + -1] = p->pArray[lVar2];
  }
  p->nSize = uVar1 - 1;
  return;
}

Assistant:

void Map_NodeVecRemove( Map_NodeVec_t * p, Map_Node_t * Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            break;
    assert( i < p->nSize );
    for ( i++; i < p->nSize; i++ )
        p->pArray[i-1] = p->pArray[i];
    p->nSize--;
}